

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O1

void __thiscall
kj::StringTree::
fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,8ul>,kj::ArrayPtr<char_const>,kj::StringPtr,kj::ArrayPtr<char_const>>
          (StringTree *this,char *pos,size_t branchIndex,StringTree *first,
          ArrayPtr<const_char> *rest,ArrayPtr<const_char> *rest_1,StringTree *rest_2,
          ArrayPtr<const_char> *rest_3,ArrayPtr<const_char> *rest_4,ArrayPtr<const_char> *rest_5,
          ArrayPtr<const_char> *rest_6,ArrayPtr<const_char> *rest_7,StringTree *rest_8,
          ArrayPtr<const_char> *rest_9,ArrayPtr<const_char> *rest_10,ArrayPtr<const_char> *rest_11,
          CappedArray<char,_8UL> *rest_12,ArrayPtr<const_char> *rest_13,StringPtr *rest_14,
          ArrayPtr<const_char> *rest_15)

{
  Branch *pBVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  Branch *pBVar4;
  size_t sVar5;
  char *pcVar6;
  
  pcVar6 = (char *)(this->text).content.size_;
  pBVar1 = (this->branches).ptr;
  if (pcVar6 != (char *)0x0) {
    pcVar6 = (this->text).content.ptr;
  }
  pBVar1[branchIndex].index = (long)pos - (long)pcVar6;
  pBVar1[branchIndex].content.size_ = first->size_;
  pcVar6 = pBVar1[branchIndex].content.text.content.ptr;
  if (pcVar6 != (char *)0x0) {
    sVar2 = pBVar1[branchIndex].content.text.content.size_;
    pBVar1[branchIndex].content.text.content.ptr = (char *)0x0;
    pBVar1[branchIndex].content.text.content.size_ = 0;
    pAVar3 = pBVar1[branchIndex].content.text.content.disposer;
    (**pAVar3->_vptr_ArrayDisposer)(pAVar3,pcVar6,1,sVar2,sVar2,0);
  }
  pBVar1[branchIndex].content.text.content.ptr = (first->text).content.ptr;
  pBVar1[branchIndex].content.text.content.size_ = (first->text).content.size_;
  pBVar1[branchIndex].content.text.content.disposer = (first->text).content.disposer;
  (first->text).content.ptr = (char *)0x0;
  (first->text).content.size_ = 0;
  pBVar4 = pBVar1[branchIndex].content.branches.ptr;
  if (pBVar4 != (Branch *)0x0) {
    sVar2 = pBVar1[branchIndex].content.branches.size_;
    pBVar1[branchIndex].content.branches.ptr = (Branch *)0x0;
    pBVar1[branchIndex].content.branches.size_ = 0;
    pAVar3 = pBVar1[branchIndex].content.branches.disposer;
    (**pAVar3->_vptr_ArrayDisposer)
              (pAVar3,pBVar4,0x40,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  }
  pBVar1[branchIndex].content.branches.ptr = (first->branches).ptr;
  pBVar1[branchIndex].content.branches.size_ = (first->branches).size_;
  pBVar1[branchIndex].content.branches.disposer = (first->branches).disposer;
  (first->branches).ptr = (Branch *)0x0;
  (first->branches).size_ = 0;
  sVar5 = rest->size_;
  if (sVar5 != 0) {
    memcpy(pos,rest->ptr,sVar5);
    pos = pos + sVar5;
  }
  sVar5 = rest_1->size_;
  if (sVar5 != 0) {
    memcpy(pos,rest_1->ptr,sVar5);
    pos = pos + sVar5;
  }
  fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,8ul>,kj::ArrayPtr<char_const>,kj::StringPtr,kj::ArrayPtr<char_const>>
            (this,pos,branchIndex + 1,rest_2,rest_3,rest_4,rest_5,rest_6,rest_7,rest_8,rest_9,
             rest_10,rest_11,rest_12,rest_13,rest_14,rest_15);
  return;
}

Assistant:

void StringTree::fill(char* pos, size_t branchIndex, StringTree&& first, Rest&&... rest) {
  branches[branchIndex].index = pos - text.begin();
  branches[branchIndex].content = kj::mv(first);
  fill(pos, branchIndex + 1, kj::fwd<Rest>(rest)...);
}